

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O0

void __thiscall SSD1306::OledI2C::displayUpdate(OledI2C *this)

{
  int __fd;
  iterator pvVar1;
  pointer __buf;
  size_type __n;
  ssize_t sVar2;
  undefined8 uVar3;
  long in_RDI;
  string what;
  uint8_t column_high;
  uint8_t column_low;
  value_type *block;
  iterator __end1;
  iterator __begin1;
  array<SSD1306::OledI2C::PixelBlock,_32UL> *__range1;
  uint8_t column;
  uint8_t page;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  string local_98 [4];
  int in_stack_ffffffffffffff6c;
  string local_78 [32];
  string *in_stack_ffffffffffffffa8;
  error_category *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  OledI2C *in_stack_ffffffffffffffc0;
  iterator local_20;
  byte local_a;
  
  local_a = 0;
  local_20 = std::array<SSD1306::OledI2C::PixelBlock,_32UL>::begin
                       ((array<SSD1306::OledI2C::PixelBlock,_32UL> *)0x1099d5);
  pvVar1 = std::array<SSD1306::OledI2C::PixelBlock,_32UL>::end
                     ((array<SSD1306::OledI2C::PixelBlock,_32UL> *)0x1099ea);
  do {
    if (local_20 == pvVar1) {
      return;
    }
    if ((local_20->dirty_ & 1U) != 0) {
      sendCommand(in_stack_ffffffffffffffc0,(uint8_t)((uint)in_stack_ffffffffffffffbc >> 0x18));
      sendCommand(in_stack_ffffffffffffffc0,(uint8_t)((uint)in_stack_ffffffffffffffbc >> 0x18));
      sendCommand(in_stack_ffffffffffffffc0,(uint8_t)((uint)in_stack_ffffffffffffffbc >> 0x18));
      __fd = FileDescriptor::fd((FileDescriptor *)(in_RDI + 0x10));
      __buf = std::array<unsigned_char,_33UL>::data((array<unsigned_char,_33UL> *)0x109aba);
      __n = std::array<unsigned_char,_33UL>::size(&local_20->bytes_);
      sVar2 = write(__fd,__buf,__n);
      if (sVar2 == -1) {
        std::__cxx11::to_string(in_stack_ffffffffffffff6c);
        std::operator+((char *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        std::operator+(in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
        std::__cxx11::string::~string(local_78);
        std::__cxx11::string::~string(local_98);
        uVar3 = __cxa_allocate_exception(0x20);
        __errno_location();
        std::_V2::system_category();
        std::system_error::system_error
                  ((system_error *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                   in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        __cxa_throw(uVar3,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      local_20->dirty_ = false;
    }
    local_a = local_a + 0x20;
    if (0x7f < local_a) {
      local_a = 0;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void
SSD1306::OledI2C::displayUpdate()
{
    uint8_t page{0};
    uint8_t column{0};

    for (auto& block : blocks_)
    {
        if (block.dirty_)
        {
            uint8_t column_low = column & 0xF;
            uint8_t column_high = (column >> 4) & 0x0F;

            sendCommand(OLED_SET_PAGE_START_ADDRESS_MASK | page);
            sendCommand(OLED_SET_COLUMN_START_LOW_MASK | column_low);
            sendCommand(OLED_SET_COLUMN_START_HIGH_MASK | column_high);

            if (::write(fd_.fd(),
                        block.bytes_.data(),
                        block.bytes_.size()) == -1)
            {
                std::string what( "write " __FILE__ "("
                                + std::to_string(__LINE__)
                                + ")" );
                throw std::system_error(errno,
                                        std::system_category(),
                                        what);
            }

            block.dirty_ = false;
        }

        column += OledI2C::ColumnsPerBlock;

        if (column >= Width)
        {
            column = 0;
            page += 1;
        }
    }
}